

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::internal::ExtensionSet::InternalSerializeMessageSetWithCachedSizesToArray
          (ExtensionSet *this,uint8 *target,EpsCopyOutputStream *stream)

{
  uint8 *in_RSI;
  ExtensionSet *unaff_retaddr;
  anon_class_16_2_d2ac9ea8 in_stack_00000008;
  
  ForEach<google::protobuf::internal::ExtensionSet::InternalSerializeMessageSetWithCachedSizesToArray(unsigned_char*,google::protobuf::io::EpsCopyOutputStream*)const::__0>
            (unaff_retaddr,in_stack_00000008);
  return in_RSI;
}

Assistant:

uint8* ExtensionSet::InternalSerializeMessageSetWithCachedSizesToArray(
    uint8* target, io::EpsCopyOutputStream* stream) const {
  ForEach([&target, stream](int number, const Extension& ext) {
    target = ext.InternalSerializeMessageSetItemWithCachedSizesToArray(
        number, target, stream);
  });
  return target;
}